

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  string flatbuffers_version;
  allocator<char> local_5fc;
  allocator<char> local_5fb;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  _Head_base<0UL,_flatbuffers::CodeGenerator_*,_false> local_5f8;
  FlatCompiler local_5f0;
  shared_ptr<flatbuffers::CodeGenerator> local_5b0;
  shared_ptr<flatbuffers::CodeGenerator> local_5a0;
  shared_ptr<flatbuffers::CodeGenerator> local_590;
  shared_ptr<flatbuffers::CodeGenerator> local_580;
  shared_ptr<flatbuffers::CodeGenerator> local_570;
  shared_ptr<flatbuffers::CodeGenerator> local_560;
  shared_ptr<flatbuffers::CodeGenerator> local_550;
  shared_ptr<flatbuffers::CodeGenerator> local_540;
  shared_ptr<flatbuffers::CodeGenerator> local_530;
  shared_ptr<flatbuffers::CodeGenerator> local_520;
  shared_ptr<flatbuffers::CodeGenerator> local_510;
  shared_ptr<flatbuffers::CodeGenerator> local_500;
  shared_ptr<flatbuffers::CodeGenerator> local_4f0;
  shared_ptr<flatbuffers::CodeGenerator> local_4e0;
  shared_ptr<flatbuffers::CodeGenerator> local_4d0;
  shared_ptr<flatbuffers::CodeGenerator> local_4c0;
  shared_ptr<flatbuffers::CodeGenerator> local_4b0;
  shared_ptr<flatbuffers::CodeGenerator> local_4a0;
  shared_ptr<flatbuffers::CodeGenerator> local_490;
  string local_480;
  undefined1 local_460 [64];
  string local_420 [32];
  string local_400 [992];
  
  __s = flatbuffers::FLATBUFFERS_VERSION();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,__s,(allocator<char> *)local_460);
  g_program_name = *argv;
  local_5f0.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5f0.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_5f0.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5f0.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_5f0.code_generators_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5f0.params_.warn_fn = Warn;
  local_5f0.params_.error_fn = Error;
  local_5f0.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5f0.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"b",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"binary",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate wire format binaries for any data definitions",&local_5fc);
  flatbuffers::NewBinaryCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_490,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_490);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_490.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"c",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"cpp",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate C++ headers for tables/structs",&local_5fc);
  flatbuffers::NewCppCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_4a0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_4a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4a0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"n",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"csharp",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate C# classes for tables/structs",&local_5fc);
  flatbuffers::NewCSharpCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_4b0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_4b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4b0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"d",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"dart",&local_5fa)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Dart classes for tables/structs",&local_5fc);
  flatbuffers::NewDartCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_4c0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_4c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4c0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"proto",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Input is a .proto, translate to .fbs",&local_5fc);
  flatbuffers::NewFBSCodeGenerator((flatbuffers *)&local_5f8,false);
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_4d0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_4d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4d0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"g",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"go",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Go files for tables/structs",&local_5fc);
  flatbuffers::NewGoCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_4e0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_4e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4e0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"j",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"java",&local_5fa)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Java classes for tables/structs",&local_5fc);
  flatbuffers::NewJavaCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_4f0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_4f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4f0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"jsonschema",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"Generate Json schema",&local_5fc);
  flatbuffers::NewJsonSchemaCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_500,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_500);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_500.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"kotlin",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Kotlin classes for tables/structs",&local_5fc);
  flatbuffers::NewKotlinCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_510,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_510);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_510.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"kotlin-kmp",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Kotlin multiplatform classes for tables/structs",&local_5fc);
  flatbuffers::NewKotlinKMPCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_520,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_520);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_520.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"lobster",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Lobster files for tables/structs",&local_5fc);
  flatbuffers::NewLobsterCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_530,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_530);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_530.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"l",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"lua",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Lua files for tables/structs",&local_5fc);
  flatbuffers::NewLuaBfbsGenerator((flatbuffers *)&local_5f8,&local_480);
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_540,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_540);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_540.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"nim",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Nim files for tables/structs",&local_5fc);
  flatbuffers::NewNimBfbsGenerator((flatbuffers *)&local_5f8,&local_480);
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_550,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_550);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_550.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"p",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"python",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Python files for tables/structs",&local_5fc);
  flatbuffers::NewPythonCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_560,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_560);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_560.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"php",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate PHP files for tables/structs",&local_5fc);
  flatbuffers::NewPhpCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_570,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_570);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_570.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"r",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"rust",&local_5fa)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Rust files for tables/structs",&local_5fc);
  flatbuffers::NewRustCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_580,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_580);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_580.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"t",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"json",&local_5fa)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate text output for any data definitions",&local_5fc);
  flatbuffers::NewTextCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_590,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_590);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_590.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_460 + 0x20),"swift",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate Swift files for tables/structs",&local_5fc);
  flatbuffers::NewSwiftCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_5a0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_5a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5a0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_460,"T",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_460 + 0x20),"ts",&local_5fa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"",&local_5fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,"Generate TypeScript code for tables/structs",&local_5fc);
  flatbuffers::NewTsCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_5b0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_5f8);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_5f0,(FlatCOption *)local_460,&local_5b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5b0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_5f8._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_5f8._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  flatbuffers::FlatCOption::~FlatCOption((FlatCOption *)local_460);
  flatbuffers::FlatCompiler::ParseFromCommandLineArguments
            ((FlatCOptions *)local_460,&local_5f0,argc,argv);
  iVar1 = flatbuffers::FlatCompiler::Compile(&local_5f0,(FlatCOptions *)local_460);
  flatbuffers::FlatCOptions::~FlatCOptions((FlatCOptions *)local_460);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
               *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_480);
  return iVar1;
}

Assistant:

int main(int argc, const char *argv[]) {
  const std::string flatbuffers_version(flatbuffers::FLATBUFFERS_VERSION());

  g_program_name = argv[0];

  flatbuffers::FlatCompiler::InitParams params;
  params.warn_fn = Warn;
  params.error_fn = Error;

  flatbuffers::FlatCompiler flatc(params);

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{
          "b", "binary", "",
          "Generate wire format binaries for any data definitions" },
      flatbuffers::NewBinaryCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "c", "cpp", "",
                                "Generate C++ headers for tables/structs" },
      flatbuffers::NewCppCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "n", "csharp", "",
                                "Generate C# classes for tables/structs" },
      flatbuffers::NewCSharpCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "d", "dart", "",
                                "Generate Dart classes for tables/structs" },
      flatbuffers::NewDartCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "proto", "",
                                "Input is a .proto, translate to .fbs" },
      flatbuffers::NewFBSCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "g", "go", "",
                                "Generate Go files for tables/structs" },
      flatbuffers::NewGoCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "j", "java", "",
                                "Generate Java classes for tables/structs" },
      flatbuffers::NewJavaCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "jsonschema", "", "Generate Json schema" },
      flatbuffers::NewJsonSchemaCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "kotlin", "",
                                "Generate Kotlin classes for tables/structs" },
      flatbuffers::NewKotlinCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "kotlin-kmp", "",
                                "Generate Kotlin multiplatform classes for tables/structs" },
      flatbuffers::NewKotlinKMPCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "lobster", "",
                                "Generate Lobster files for tables/structs" },
      flatbuffers::NewLobsterCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "l", "lua", "",
                                "Generate Lua files for tables/structs" },
      flatbuffers::NewLuaBfbsGenerator(flatbuffers_version));

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "nim", "",
                                "Generate Nim files for tables/structs" },
      flatbuffers::NewNimBfbsGenerator(flatbuffers_version));

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "p", "python", "",
                                "Generate Python files for tables/structs" },
      flatbuffers::NewPythonCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "php", "",
                                "Generate PHP files for tables/structs" },
      flatbuffers::NewPhpCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "r", "rust", "",
                                "Generate Rust files for tables/structs" },
      flatbuffers::NewRustCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{
          "t", "json", "", "Generate text output for any data definitions" },
      flatbuffers::NewTextCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "swift", "",
                                "Generate Swift files for tables/structs" },
      flatbuffers::NewSwiftCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "T", "ts", "",
                                "Generate TypeScript code for tables/structs" },
      flatbuffers::NewTsCodeGenerator());

  // Create the FlatC options by parsing the command line arguments.
  const flatbuffers::FlatCOptions &options =
      flatc.ParseFromCommandLineArguments(argc, argv);

  // Compile with the extracted FlatC options.
  return flatc.Compile(options);
}